

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

bool __thiscall Lexer::isPattern(Lexer *this,string *token,Type *type)

{
  bool bVar1;
  char *pcVar2;
  bool local_cb;
  bool local_ca;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  string word;
  size_t marker;
  Type *type_local;
  string *token_local;
  Lexer *this_local;
  
  if ((this->_enablePattern & 1U) != 0) {
    word.field_2._8_8_ = this->_cursor;
    std::__cxx11::string::string((string *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"/",&local_71);
    bVar1 = readWord(&this->_text,&local_70,&this->_cursor,(string *)local_50);
    local_ca = false;
    if (bVar1) {
      bVar1 = isEOS(this);
      local_cb = true;
      if (!bVar1) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
        local_cb = unicodeWhitespace((int)*pcVar2);
      }
      local_ca = local_cb;
    }
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    if (local_ca != false) {
      std::__cxx11::string::substr((ulong)local_a8,(ulong)this);
      std::__cxx11::string::operator=((string *)token,local_a8);
      std::__cxx11::string::~string(local_a8);
      *type = pattern;
      this_local._7_1_ = 1;
    }
    else {
      this->_cursor = word.field_2._8_8_;
    }
    std::__cxx11::string::~string((string *)local_50);
    if (local_ca != false) goto LAB_0010895c;
  }
  this_local._7_1_ = 0;
LAB_0010895c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Lexer::isPattern (std::string& token, Lexer::Type& type)
{
  if (_enablePattern)
  {
    std::size_t marker = _cursor;

    std::string word;
    if (readWord (_text, "/", _cursor, word) &&
        (isEOS () ||
         unicodeWhitespace (_text[_cursor])))
    {
      token = _text.substr (marker, _cursor - marker);
      type = Lexer::Type::pattern;
      return true;
    }

    _cursor = marker;
  }

  return false;
}